

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.c
# Opt level: O2

rt_function_error_t exec_convolution_int8(rt_function_t *f)

{
  var_t *var;
  var_t *var_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 *puVar14;
  var_t *var_01;
  int *piVar15;
  rt_variable_t *prVar16;
  void *pvVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  rt_variable_getter p_Var22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  undefined1 uVar36;
  rt_variable_t *prVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  ulong uVar47;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int i_pos [3];
  int w_pos [3];
  int o_pos [3];
  
  puVar14 = (undefined8 *)f->local_context;
  var_01 = (var_t *)*puVar14;
  iVar4 = *(int *)(puVar14 + 8);
  iVar5 = var_01[1].shape.data[2];
  piVar15 = (var_01->shape).data;
  iVar6 = piVar15[2];
  shape._4_4_ = 0;
  shape.size = (var_01->shape).size;
  shape.data = piVar15;
  uVar26 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = var_01[3].shape.size;
  shape_00.data = var_01[3].shape.data;
  uVar27 = calc_shape_size(shape_00);
  prVar37 = var_01->v;
  prVar16 = var_01[3].v;
  if (prVar16 != (rt_variable_t *)0x0) {
    bVar1 = (byte)prVar16->field_0x10 >> 4;
    bVar2 = (byte)prVar37->field_0x10 >> 4;
    if (bVar2 < bVar1) {
      pvVar17 = prVar16->data;
      for (uVar40 = 0; uVar27 != uVar40; uVar40 = uVar40 + 1) {
        *(char *)((long)pvVar17 + uVar40) =
             (char)((int)*(char *)((long)pvVar17 + uVar40) / (1 << (bVar1 - bVar2 & 0x1f)));
      }
      prVar37 = var_01->v;
    }
    else if (bVar1 < bVar2) {
      puts(
          "OUTPUT variable has less range bits than BIAS variable. Please make sure conv/b has same or less range bits than Output to avoid overflow."
          );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  var = var_01 + 3;
  var_00 = var_01 + 4;
  memset(prVar37->data,0,(ulong)uVar26);
  iVar7 = *var_01[1].shape.data;
  if (*(int *)&var_01[5].v == 2) {
    for (iVar38 = 0; iVar38 != iVar7; iVar38 = iVar38 + 1) {
      for (iVar45 = 0; iVar45 != iVar4; iVar45 = iVar45 + 1) {
        for (iVar46 = 0; iVar46 != iVar6; iVar46 = iVar46 + 1) {
          o_pos[0] = iVar38;
          o_pos[1] = iVar45;
          o_pos[2] = iVar46;
          var_setpos(var_01,o_pos,3);
          for (iVar30 = 0; iVar30 != iVar5; iVar30 = iVar30 + 1) {
            i_pos[0] = iVar38;
            i_pos[1] = iVar45;
            i_pos[2] = iVar30;
            w_pos[0] = iVar45;
            w_pos[1] = iVar46;
            w_pos[2] = iVar30;
            var_setpos(var_01 + 1,i_pos,3);
            var_setpos(var_01 + 2,w_pos,3);
            piVar15 = var_01[5].shape.data;
            piVar18 = (int *)puVar14[7];
            piVar19 = (int *)puVar14[3];
            piVar20 = (int *)puVar14[5];
            piVar21 = var_01[5].stride.data;
            p_Var22 = var_01[5].get;
            pvVar17 = var_01->v->data;
            pvVar23 = (var_01[1].v)->data;
            pvVar24 = (var_01[2].v)->data;
            bVar1 = (var_01[1].v)->field_0x10;
            bVar2 = (var_01[2].v)->field_0x10;
            bVar3 = var_01->v->field_0x10;
            iVar39 = -*piVar19;
            for (iVar41 = 0; iVar41 < *(int *)p_Var22; iVar41 = iVar41 + 1) {
              iVar35 = -piVar19[1];
              for (lVar43 = 0; lVar33 = (long)*(int *)(p_Var22 + 4), lVar43 < lVar33;
                  lVar43 = lVar43 + 1) {
                iVar28 = *piVar21;
                iVar42 = 0;
                if (iVar28 < 1) {
                  iVar28 = 0;
                }
                iVar29 = 0;
                for (; iVar42 != iVar28; iVar42 = iVar42 + 1) {
                  uVar26 = piVar21[1];
                  uVar40 = 0;
                  if (0 < (int)uVar26) {
                    uVar40 = (ulong)uVar26;
                  }
                  for (uVar47 = 0; uVar40 != uVar47; uVar47 = uVar47 + 1) {
                    uVar27 = piVar18[1] * (int)uVar47 + iVar35;
                    if ((((-1 < (int)uVar27) && (iVar8 = piVar15[1], (int)uVar27 < iVar8)) &&
                        (iVar44 = *piVar18 * iVar42 + iVar39, -1 < iVar44)) && (iVar44 < *piVar15))
                    {
                      iVar29 = iVar29 + (int)*(char *)((long)pvVar24 +
                                                      uVar47 + (ulong)var_01[2].offset +
                                                               (long)(int)(uVar26 * iVar42)) *
                                        (int)*(char *)((long)pvVar23 +
                                                      (ulong)uVar27 +
                                                      (ulong)(uint)(iVar8 * iVar44) +
                                                      (ulong)var_01[1].offset);
                    }
                  }
                }
                lVar33 = lVar33 * iVar41 + (ulong)var_01->offset;
                iVar42 = iVar29 / (1 << (((bVar2 >> 4) + (bVar1 >> 4)) - (bVar3 >> 4) & 0x1f)) +
                         (int)*(char *)((long)pvVar17 + lVar43 + lVar33);
                iVar28 = iVar42;
                if (iVar42 < -0x7f) {
                  iVar28 = 0x80;
                }
                uVar36 = (undefined1)iVar28;
                if (0x7e < iVar42) {
                  uVar36 = 0x7f;
                }
                *(undefined1 *)((long)pvVar17 + lVar43 + lVar33) = uVar36;
                iVar35 = iVar35 + piVar20[1];
              }
              iVar39 = iVar39 + *piVar20;
            }
          }
          i_pos[0] = iVar45;
          i_pos[1] = iVar46;
          if (var_00->v != (rt_variable_t *)0x0) {
            var_setpos(var_00,i_pos,2);
            mul_alpha(var_01,var_00);
          }
          if (var->v != (rt_variable_t *)0x0) {
            var_setpos(var,i_pos,2);
            add_bias(var_01,var);
          }
        }
      }
    }
  }
  else {
    for (iVar38 = 0; iVar38 != iVar7; iVar38 = iVar38 + 1) {
      for (iVar45 = 0; iVar45 != iVar4; iVar45 = iVar45 + 1) {
        for (iVar46 = 0; iVar46 != iVar6; iVar46 = iVar46 + 1) {
          o_pos[0] = iVar38;
          o_pos[1] = iVar45;
          o_pos[2] = iVar46;
          var_setpos(var_01,o_pos,3);
          for (iVar30 = 0; iVar30 != iVar5; iVar30 = iVar30 + 1) {
            i_pos[0] = iVar38;
            i_pos[1] = iVar45;
            i_pos[2] = iVar30;
            w_pos[0] = iVar45;
            w_pos[1] = iVar46;
            w_pos[2] = iVar30;
            var_setpos(var_01 + 1,i_pos,3);
            var_setpos(var_01 + 2,w_pos,3);
            uVar26 = *(uint *)&var_01[5].v;
            uVar27 = var_01[5].shape.size;
            piVar15 = var_01[5].shape.data;
            lVar43 = puVar14[7];
            lVar33 = puVar14[3];
            lVar25 = puVar14[5];
            uVar9 = var_01[6].shape.size;
            piVar18 = var_01[6].shape.data;
            uVar10 = var_01[5].offset;
            prVar37 = var_01[6].v;
            uVar11 = var_01[5].stride.size;
            piVar19 = var_01[5].stride.data;
            pvVar17 = var_01->v->data;
            pvVar23 = (var_01[1].v)->data;
            pvVar24 = (var_01[2].v)->data;
            uVar12 = *(uint *)&var_01[5].set;
            shape_01._4_4_ = 0;
            shape_01.size = uVar12;
            p_Var22 = var_01[5].get;
            shape_01.data = (int *)p_Var22;
            uVar31 = calc_shape_size(shape_01);
            shape_02._4_4_ = 0;
            shape_02.size = uVar11;
            shape_02.data = piVar19;
            uVar32 = calc_shape_size(shape_02);
            bVar1 = (var_01[1].v)->field_0x10;
            bVar2 = (var_01[2].v)->field_0x10;
            bVar3 = var_01->v->field_0x10;
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            for (uVar40 = 0; uVar40 != uVar31; uVar40 = uVar40 + 1) {
              out._4_4_ = 0;
              out.size = uVar9;
              shape_04._4_4_ = 0;
              shape_04.size = uVar12;
              out.data = piVar18;
              shape_04.data = (int *)p_Var22;
              pos_to_shape(out,shape_04,(int)uVar40);
              iVar39 = 0;
              for (uVar47 = 0; uVar47 != uVar32; uVar47 = uVar47 + 1) {
                out_00._4_4_ = 0;
                out_00.size = uVar10;
                shape_05._4_4_ = 0;
                shape_05.size = uVar11;
                out_00.data = (int *)prVar37;
                shape_05.data = piVar19;
                pos_to_shape(out_00,shape_05,(int)uVar47);
                uVar34 = 0;
                while (uVar26 != uVar34) {
                  iVar41 = (&(prVar37->shape).size)[uVar34] * *(int *)(lVar43 + uVar34 * 4);
                  (&(prVar37->shape).size)[uVar34] = iVar41;
                  iVar41 = iVar41 - *(int *)(lVar33 + uVar34 * 4);
                  (&(prVar37->shape).size)[uVar34] = iVar41;
                  iVar41 = *(int *)(lVar25 + uVar34 * 4) * piVar18[uVar34] + iVar41;
                  (&(prVar37->shape).size)[uVar34] = iVar41;
                  if ((iVar41 < 0) ||
                     (piVar20 = piVar15 + uVar34, uVar34 = uVar34 + 1, *piVar20 <= iVar41))
                  goto LAB_00119de4;
                }
                uVar13 = var_01[1].offset;
                shape_03._4_4_ = 0;
                shape_03.size = uVar27;
                pos._4_4_ = 0;
                pos.size = uVar10;
                shape_03.data = piVar15;
                pos.data = (int *)prVar37;
                iVar41 = shape_to_pos(shape_03,pos);
                iVar39 = iVar39 + (int)*(char *)((long)pvVar24 + uVar47 + var_01[2].offset) *
                                  (int)*(char *)((long)pvVar23 + (long)iVar41 + (ulong)uVar13);
LAB_00119de4:
              }
              iVar41 = iVar39 / (1 << (((bVar2 >> 4) + (bVar1 >> 4)) - (bVar3 >> 4) & 0x1f)) +
                       (int)*(char *)((long)pvVar17 + uVar40 + var_01->offset);
              iVar39 = iVar41;
              if (iVar41 < -0x7f) {
                iVar39 = 0x80;
              }
              uVar36 = (undefined1)iVar39;
              if (0x7e < iVar41) {
                uVar36 = 0x7f;
              }
              *(undefined1 *)((long)pvVar17 + uVar40 + var_01->offset) = uVar36;
            }
          }
          i_pos[0] = iVar45;
          i_pos[1] = iVar46;
          if (var_00->v != (rt_variable_t *)0x0) {
            var_setpos(var_00,i_pos,2);
            mul_alpha(var_01,var_00);
          }
          if (var->v != (rt_variable_t *)0x0) {
            var_setpos(var,i_pos,2);
            add_bias(var_01,var);
          }
        }
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_convolution_int8(rt_function_t *f) {
  convolution_local_context_t *c =
      (convolution_local_context_t *)f->local_context;
  convolution_private_t *p = (convolution_private_t *)(c->data);

  nn_size_t group = c->group;
  nn_size_t in_vars = p->in_var.shape.data[I];
  nn_size_t out_vars = p->out_var.shape.data[I];
  nn_size_t batch_size;
  nn_size_t om, im, g, b;

  var_t *out_var = &p->out_var;
  var_t *in_var = &p->in_var;
  var_t *w_var = &p->w_var;
  var_t *b_var = &p->b_var;
  var_t *a_var = &p->a_var;

  const unsigned output_size = calc_shape_size(out_var->shape);
  const unsigned bias_size = calc_shape_size(b_var->shape);

  if (p->b_var.v) {
    unsigned int b_fp = b_var->v->fp_pos;
    unsigned int out_fp = out_var->v->fp_pos;

    // If bias has less range bits (=more precision bits) than output, rescale
    // bias.
    // Otherwise, output has too few range bits. Change format before starting
    // computations.
    if (b_fp > out_fp) {
      int i;
      int8_t *b_data = (int8_t *)(b_var->v->data);
      for (i = 0; i < bias_size; i++) {
        *(b_data + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure conv/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  memset(out_var->v->data, 0, sizeof(int8_t) * output_size);

  batch_size = p->in_var.shape.data[0];
  if (p->spatial_dims == 2) {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            conv2d(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  } else {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            convnd(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}